

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPlugin.cpp
# Opt level: O1

void __thiscall
DISTRHO::Plugin::Plugin
          (Plugin *this,uint32_t parameterCount,uint32_t programCount,uint32_t stateCount)

{
  PrivateData *this_00;
  undefined8 *puVar1;
  ulong *puVar2;
  long lVar3;
  Parameter *this_01;
  
  this->_vptr_Plugin = (_func_int **)&PTR__Plugin_00112b50;
  this_00 = (PrivateData *)operator_new(0x60);
  PrivateData::PrivateData(this_00);
  this->pData = this_00;
  puVar1 = (undefined8 *)operator_new__(0x108);
  *puVar1 = 4;
  lVar3 = 0;
  do {
    *(undefined4 *)((long)puVar1 + lVar3 + 8) = 0;
    *(undefined1 **)((long)puVar1 + lVar3 + 0x10) = &String::_null()::sNull;
    *(undefined8 *)((long)puVar1 + lVar3 + 0x18) = 0;
    *(undefined1 *)((long)puVar1 + lVar3 + 0x20) = 0;
    *(undefined1 **)((long)puVar1 + lVar3 + 0x28) = &String::_null()::sNull;
    *(undefined8 *)((long)puVar1 + lVar3 + 0x30) = 0;
    *(undefined1 *)((long)puVar1 + lVar3 + 0x38) = 0;
    *(undefined8 *)((long)puVar1 + lVar3 + 0x40) = 0xffffffff;
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 0x100);
  this_00->audioPorts = (AudioPortWithBusId *)(puVar1 + 1);
  if (parameterCount != 0) {
    this_00->parameterCount = parameterCount;
    lVar3 = (ulong)parameterCount * 0xb0;
    puVar2 = (ulong *)operator_new__(lVar3 + 8);
    *puVar2 = (ulong)parameterCount;
    this_01 = (Parameter *)(puVar2 + 1);
    do {
      Parameter::Parameter(this_01);
      this_01 = this_01 + 1;
      lVar3 = lVar3 + -0xb0;
    } while (lVar3 != 0);
    this->pData->parameters = (Parameter *)(puVar2 + 1);
  }
  if (programCount != 0) {
    d_stderr2("DPF warning: Plugins with programs must define `DISTRHO_PLUGIN_WANT_PROGRAMS` to 1");
  }
  if (stateCount == 0) {
    return;
  }
  d_stderr2("DPF warning: Plugins with state must define `DISTRHO_PLUGIN_WANT_STATE` to 1");
  return;
}

Assistant:

Plugin::Plugin(uint32_t parameterCount, uint32_t programCount, uint32_t stateCount)
    : pData(new PrivateData())
{
#if DISTRHO_PLUGIN_NUM_INPUTS+DISTRHO_PLUGIN_NUM_OUTPUTS > 0
    pData->audioPorts = new AudioPortWithBusId[DISTRHO_PLUGIN_NUM_INPUTS+DISTRHO_PLUGIN_NUM_OUTPUTS];
#endif

#ifdef DPF_ABORT_ON_ERROR
# define DPF_ABORT abort();
#else
# define DPF_ABORT
#endif

    if (parameterCount > 0)
    {
        pData->parameterCount = parameterCount;
        pData->parameters     = new Parameter[parameterCount];
    }

    if (programCount > 0)
    {
#if DISTRHO_PLUGIN_WANT_PROGRAMS
        pData->programCount = programCount;
        pData->programNames = new String[programCount];
#else
        d_stderr2("DPF warning: Plugins with programs must define `DISTRHO_PLUGIN_WANT_PROGRAMS` to 1");
        DPF_ABORT
#endif
    }

    if (stateCount > 0)
    {
#if DISTRHO_PLUGIN_WANT_STATE
        pData->stateCount     = stateCount;
        pData->stateKeys      = new String[stateCount];
        pData->stateDefValues = new String[stateCount];
#else
        d_stderr2("DPF warning: Plugins with state must define `DISTRHO_PLUGIN_WANT_STATE` to 1");
        DPF_ABORT
#endif
    }

#undef DPF_ABORT
}